

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AV1ResizeYTest_DISABLED_SpeedTest_Test::
~AV1ResizeYTest_DISABLED_SpeedTest_Test(AV1ResizeYTest_DISABLED_SpeedTest_Test *this)

{
  AV1ResizeYTest_DISABLED_SpeedTest_Test *in_stack_00000010;
  
  anon_unknown.dwarf_122557b::AV1ResizeYTest_DISABLED_SpeedTest_Test::
  ~AV1ResizeYTest_DISABLED_SpeedTest_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(AV1ResizeYTest, DISABLED_SpeedTest) { SpeedTest(); }